

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_algebra.cxx
# Opt level: O0

void __thiscall HAXX_ALGEBRA::norm::test_method(norm *this)

{
  undefined8 uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double distDiff;
  double distP1Q1;
  double distQP;
  double distPQ;
  double a;
  quaternion<double> p1;
  quaternion<double> q1;
  quaternion<double> p;
  double nrmStupid;
  double nrm;
  quaternion<double> q;
  quaternion<double> *in_stack_fffffffffffff938;
  quaternion<double> *in_stack_fffffffffffff940;
  char *in_stack_fffffffffffff948;
  quaternion<double> *in_stack_fffffffffffff960;
  basic_cstring<const_char> *this_00;
  undefined1 local_540 [32];
  undefined1 local_520 [40];
  undefined1 local_4f8 [16];
  basic_cstring<const_char> local_4e8;
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [40];
  undefined1 local_490 [16];
  basic_cstring<const_char> local_480;
  undefined1 local_470 [32];
  undefined1 local_450 [40];
  undefined1 local_428 [16];
  basic_cstring<const_char> local_418;
  undefined1 local_408 [32];
  undefined1 local_3e8 [40];
  undefined1 local_3c0 [16];
  basic_cstring<const_char> local_3b0;
  undefined1 local_3a0 [24];
  undefined1 local_388 [40];
  undefined1 local_360 [16];
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  undefined1 local_330 [40];
  undefined1 local_308 [16];
  basic_cstring<const_char> local_2f8 [2];
  basic_cstring<const_char> local_2d8;
  undefined1 local_2c8 [40];
  undefined1 local_2a0 [16];
  basic_cstring<const_char> local_290 [15];
  double local_1a0 [5];
  double local_178;
  quaternion<double> local_150;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  quaternion<double> local_f8;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  quaternion<double> local_b8;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  quaternion<double> local_78;
  quaternion<double> local_58;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_58._M_imag_k = 3.0;
  local_58._M_imag_j = 4.0;
  HAXX::quaternion<double>::quaternion
            (&local_28,&local_30,&local_38,&local_58._M_imag_k,&local_58._M_imag_j);
  local_58._M_imag_i = HAXX::norm<double>(in_stack_fffffffffffff960);
  dVar3 = HAXX::quaternion<double>::real(&local_28);
  auVar6._0_8_ = HAXX::quaternion<double>::real(&local_28);
  dVar4 = HAXX::quaternion<double>::imag_i(&local_28);
  dVar5 = HAXX::quaternion<double>::imag_i(&local_28);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar3;
  auVar6._8_8_ = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4 * dVar5;
  auVar6 = vfmadd213sd_fma(auVar6,auVar9,auVar12);
  dVar3 = HAXX::quaternion<double>::imag_j(&local_28);
  auVar7._0_8_ = HAXX::quaternion<double>::imag_j(&local_28);
  auVar7._8_56_ = extraout_var;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar6._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  auVar6 = vfmadd213sd_fma(auVar7._0_16_,auVar10,auVar13);
  dVar3 = HAXX::quaternion<double>::imag_k(&local_28);
  auVar8._0_8_ = HAXX::quaternion<double>::imag_k(&local_28);
  auVar8._8_56_ = extraout_var_00;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar6._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar6 = vfmadd213sd_fma(auVar8._0_16_,auVar11,auVar14);
  local_58._M_real = auVar6._0_8_;
  local_58._M_real = sqrt(local_58._M_real);
  local_80 = 8.43;
  local_88 = -9.3829;
  local_90 = -10.3;
  local_98 = 3.14;
  HAXX::quaternion<double>::quaternion(&local_78,&local_80,&local_88,&local_90,&local_98);
  local_c0 = 7.0;
  local_c8 = 2.43;
  local_d0 = 3.65;
  local_d8 = 7.006;
  HAXX::quaternion<double>::quaternion(&local_b8,&local_c0,&local_c8,&local_d0,&local_d8);
  local_100 = 4.0;
  local_108 = 2.0;
  local_110 = 3.0;
  local_118 = 7.0;
  HAXX::quaternion<double>::quaternion(&local_f8,&local_100,&local_108,&local_110,&local_118);
  local_120 = 0.543;
  HAXX::operator-(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_128 = HAXX::norm<double>(in_stack_fffffffffffff960);
  HAXX::operator-(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_150._M_real = HAXX::norm<double>(in_stack_fffffffffffff960);
  HAXX::operator+(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_178 = HAXX::norm<double>(in_stack_fffffffffffff960);
  HAXX::operator*(&in_stack_fffffffffffff940->_M_real,in_stack_fffffffffffff938);
  HAXX::operator+(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  HAXX::operator+(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  HAXX::operator*(&in_stack_fffffffffffff940->_M_real,in_stack_fffffffffffff938);
  HAXX::operator+(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  HAXX::operator+(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  HAXX::operator-(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_1a0[0] = HAXX::norm<double>(in_stack_fffffffffffff960);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff940);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_290,0x3d,local_2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff948,(char (*) [1])in_stack_fffffffffffff940);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    in_stack_fffffffffffff948 = "nrmStupid";
    in_stack_fffffffffffff940 = &local_58;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_2c8,&local_2d8,0x3d,1,2,&local_58._M_imag_i,"nrm");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18ccf3);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff940);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_2f8,0x3e,local_308);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff948,(char (*) [1])in_stack_fffffffffffff940);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    in_stack_fffffffffffff948 = "distQP";
    in_stack_fffffffffffff940 = &local_150;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_330,&local_340,0x3e,1,2,&local_128,"distPQ");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18ce14);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff940);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_350,0x3f,local_360);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff948,(char (*) [1])in_stack_fffffffffffff940);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3a0 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_3a0._0_8_ = local_120 * local_178;
    in_stack_fffffffffffff948 = "a*distP1Q1";
    in_stack_fffffffffffff940 = (quaternion<double> *)local_3a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_388,local_3a0 + 8,0x3f,1,2,local_1a0,"distDiff");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18cf54);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff940);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b0,0x41,local_3c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff948,(char (*) [1])in_stack_fffffffffffff940);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_408 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_408._8_8_ = HAXX::quaternion<double>::real(&local_28);
    local_408._0_8_ = 1.0;
    in_stack_fffffffffffff948 = "1.";
    in_stack_fffffffffffff940 = (quaternion<double> *)local_408;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_3e8,local_408 + 0x10,0x41,1,2,local_408 + 8,"q.real()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18d0b1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff940);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_418,0x42,local_428);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff948,(char (*) [1])in_stack_fffffffffffff940);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_470 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_470._8_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    local_470._0_8_ = 2.0;
    in_stack_fffffffffffff948 = "2.";
    in_stack_fffffffffffff940 = (quaternion<double> *)local_470;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_450,local_470 + 0x10,0x42,1,2,local_470 + 8,"q.imag_i()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18d208);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff940);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_480,0x43,local_490);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff948,(char (*) [1])in_stack_fffffffffffff940);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_4d8 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_4d8._8_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_4d8._0_8_ = 3.0;
    in_stack_fffffffffffff948 = "3.";
    in_stack_fffffffffffff940 = (quaternion<double> *)local_4d8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_4b8,local_4d8 + 0x10,0x43,1,2,local_4d8 + 8,"q.imag_j()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18d341);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    this_00 = &local_4e8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff940);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,this_00,0x44,local_4f8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff948,(char (*) [1])in_stack_fffffffffffff940);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_540 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_540._8_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_540._0_8_ = 4.0;
    in_stack_fffffffffffff948 = "4.";
    in_stack_fffffffffffff940 = (quaternion<double> *)local_540;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_520,local_540 + 0x10,0x44,1,2,local_540 + 8,"q.imag_k()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18d47a);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(norm)
{
  HAXX::quaternion<double> q(1.,2.,3.,4.);
  double nrm = HAXX::norm(q);
  double nrmStupid = 
    q.real() * q.real() +
    q.imag_i() * q.imag_i() +
    q.imag_j() * q.imag_j() +
    q.imag_k() * q.imag_k();

  nrmStupid = std::sqrt(nrmStupid);


  HAXX::quaternion<double> p(8.43,-9.3829,-10.3,3.14);
  HAXX::quaternion<double> q1(7.,2.43,3.65,7.006);
  HAXX::quaternion<double> p1(4.,2.,3.,7.);
  double a = 0.543;

  // Distance function
  double distPQ = HAXX::norm(p - q);
  double distQP = HAXX::norm(q - p);

  // Scaled distance
  double distP1Q1 = HAXX::norm(p1 + q1);
  double distDiff = HAXX::norm((p + a*p1 + q + a*q1) - (p + q));

  
  BOOST_CHECK_EQUAL(nrm,nrmStupid);
  BOOST_CHECK_EQUAL(distPQ,distQP);
  BOOST_CHECK_EQUAL(distDiff,a*distP1Q1);

  BOOST_CHECK_EQUAL(q.real(),  1.);
  BOOST_CHECK_EQUAL(q.imag_i(),2.);
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);

}